

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
EqualsFailure::EqualsFailure
          (EqualsFailure *this,UtestShell *test,char *fileName,size_t lineNumber,char *expected,
          char *actual,SimpleString *text)

{
  SimpleString *in_RDI;
  TestFailure *in_R9;
  SimpleString *in_stack_ffffffffffffff80;
  SimpleString *in_stack_ffffffffffffff88;
  SimpleString *in_stack_ffffffffffffff90;
  TestFailure *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffb8;
  SimpleString *in_stack_ffffffffffffffc0;
  TestFailure *in_stack_ffffffffffffffc8;
  
  TestFailure::TestFailure
            (in_R9,(UtestShell *)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  in_RDI->buffer_ = (char *)&PTR__EqualsFailure_001ca830;
  TestFailure::createUserText(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  SimpleString::operator=(in_stack_ffffffffffffff80,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17e820);
  StringFromOrNull((char *)in_stack_ffffffffffffff88);
  StringFromOrNull((char *)in_stack_ffffffffffffff88);
  TestFailure::createButWasString
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SimpleString::operator+=(in_stack_ffffffffffffff80,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17e87a);
  SimpleString::~SimpleString((SimpleString *)0x17e884);
  SimpleString::~SimpleString((SimpleString *)0x17e88e);
  return;
}

Assistant:

EqualsFailure::EqualsFailure(UtestShell* test, const char* fileName, size_t lineNumber, const char* expected, const char* actual, const SimpleString& text) :
    TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(StringFromOrNull(expected), StringFromOrNull(actual));
}